

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::dht_announce(torrent *this)

{
  info_hash_t *this_00;
  _func_int **pp_Var1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  time_point tVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  announce_flags_t flags;
  weak_ptr<libtorrent::aux::torrent> self;
  anon_class_24_3_bfd47678 local_60;
  sha1_hash local_48;
  
  iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x49])();
  if (CONCAT44(extraout_var,iVar5) == 0) {
    UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
    pcVar7 = "DHT: no dht initialized";
LAB_002d72b9:
    (*UNRECOVERED_JUMPTABLE)(this,pcVar7);
    return;
  }
  bVar3 = should_announce_dht(this);
  pp_Var1 = (this->super_request_callback)._vptr_request_callback;
  if (bVar3) {
    (*pp_Var1[7])(this,"START DHT announce");
    tVar6 = time_now();
    (this->m_dht_start_time).__d.__r = (rep)tVar6.__d.__r;
    bVar3 = is_seed(this);
    if ((this->field_0x5e0 & 2) == 0) {
      flags.m_val = bVar3;
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      bVar4 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var_00,iVar5),0x8021)
      ;
      if (bVar4) {
        flags.m_val = bVar3 | 2;
      }
    }
    else {
      flags.m_val = bVar3 | 4;
    }
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    ::std::__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libtorrent::aux::torrent,void>
              ((__weak_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&self,
               (__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.flags);
    peVar2 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = &peVar2->m_info_hash;
    local_60.flags = &flags;
    local_60.this = this;
    local_60.self = &self;
    bVar3 = info_hash_t::has_v1(this_00);
    if (bVar3) {
      dht_announce::anon_class_24_3_bfd47678::operator()(&local_60,&this_00->v1,V1);
    }
    bVar3 = info_hash_t::has_v2(this_00);
    if (bVar3) {
      local_48.m_number._M_elems[4] = (peVar2->m_info_hash).v2.m_number._M_elems[4];
      local_48.m_number._M_elems._0_8_ = *(undefined8 *)(peVar2->m_info_hash).v2.m_number._M_elems;
      local_48.m_number._M_elems._8_8_ =
           *(undefined8 *)((peVar2->m_info_hash).v2.m_number._M_elems + 2);
      dht_announce::anon_class_24_3_bfd47678::operator()(&local_60,&local_48,V2);
    }
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&self.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    iVar5 = (*pp_Var1[6])(this);
    if ((char)iVar5 != '\0') {
      if ((char)this->field_0x5cc < '\0') {
        iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar3 = session_settings::get_bool
                          ((session_settings *)CONCAT44(extraout_var_01,iVar5),0x8017);
        if (!bVar3) {
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"DHT: i2p torrent (and mixed peers not allowed)");
        }
      }
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x45])();
      if ((char)iVar5 == '\0') {
        (*(this->super_request_callback)._vptr_request_callback[7])(this,"DHT: no listen sockets");
      }
      if ((0 < (((this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_files).m_piece_length) && ((this->field_0x5c0 & 8) == 0)) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: files not checked, skipping DHT announce");
      }
      if ((this->field_0x5e0 & 1) == 0) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: queueing disabled DHT announce");
      }
      if (((this->super_torrent_hot_members).field_0x4b & 8) != 0) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: torrent paused, no DHT announce");
      }
      if ((this->field_0x5cc & 0x20) == 0) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: torrent has DHT disabled flag");
      }
      peVar2 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((0 < (peVar2->m_files).m_piece_length) && (((peVar2->m_flags).m_val & 2) != 0)) {
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"DHT: private torrent, no DHT announce");
      }
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      bVar3 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var_02,iVar5),0x8004)
      ;
      if ((bVar3) && (bVar3 = tracker_list::any_verified(&this->m_trackers), bVar3)) {
        UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
        pcVar7 = "DHT: only using DHT as fallback and there are working trackers";
        goto LAB_002d72b9;
      }
    }
  }
  return;
}

Assistant:

void torrent::dht_announce()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_ses.dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("DHT: no dht initialized");
#endif
			return;
		}
		if (!should_announce_dht())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
#if TORRENT_USE_I2P
				if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
					debug_log("DHT: i2p torrent (and mixed peers not allowed)");
#endif
				if (!m_ses.announce_dht())
					debug_log("DHT: no listen sockets");

				if (m_torrent_file->is_valid() && !m_files_checked)
					debug_log("DHT: files not checked, skipping DHT announce");

				if (!m_announce_to_dht)
					debug_log("DHT: queueing disabled DHT announce");

				if (m_paused)
					debug_log("DHT: torrent paused, no DHT announce");

				if (!m_enable_dht)
					debug_log("DHT: torrent has DHT disabled flag");

				if (m_torrent_file->is_valid() && m_torrent_file->priv())
					debug_log("DHT: private torrent, no DHT announce");

				if (settings().get_bool(settings_pack::use_dht_as_fallback)
					&& m_trackers.any_verified())
				{
					debug_log("DHT: only using DHT as fallback and there are working trackers");
				}
			}
#endif
			return;
		}

		TORRENT_ASSERT(!m_paused);

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("START DHT announce");
		m_dht_start_time = aux::time_now();
#endif

		// if we're a seed, we tell the DHT for better scrape stats
		dht::announce_flags_t flags = is_seed() ? dht::announce::seed : dht::announce_flags_t{};

		// If this is an SSL torrent the announce needs to specify an SSL
		// listen port. DHT nodes only operate on non-SSL ports so SSL
		// torrents cannot use implied_port.
		// if we allow incoming uTP connections, set the implied_port
		// argument in the announce, this will make the DHT node use
		// our source port in the packet as our listen port, which is
		// likely more accurate when behind a NAT
		if (is_ssl_torrent())
		{
			flags |= dht::announce::ssl_torrent;
		}
		else if (settings().get_bool(settings_pack::enable_incoming_utp))
		{
			flags |= dht::announce::implied_port;
		}

		std::weak_ptr<torrent> self(shared_from_this());
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version v)
		{
			m_ses.dht()->announce(ih, 0, flags
				, std::bind(&torrent::on_dht_announce_response_disp, self, v, _1));
		});
	}